

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenWriteDisconnected(FdObserver *this)

{
  SourceLocation location;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  Promise<void> *pPVar1;
  long in_RSI;
  FdObserver *this_00;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_60;
  SourceLocation local_48;
  undefined1 local_30 [8];
  PromiseFulfillerPair<void> paf;
  FdObserver *this_local;
  
  this_00 = this;
  SourceLocation::SourceLocation
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
             ,"whenWriteDisconnected",0x213,0xe);
  location.function = (char *)local_48._16_8_;
  location.fileName = local_48.function;
  location._16_8_ = this_00;
  newPromiseAndFulfiller<void>(location);
  t = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(&local_60,t);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
            ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0x40),
             &local_60);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_60);
  pPVar1 = mv<kj::Promise<void>>((Promise<void> *)local_30);
  Promise<void>::Promise((Promise<void> *)this_00,pPVar1);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenWriteDisconnected() {
  auto paf = newPromiseAndFulfiller<void>();
  hupFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}